

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O3

void KillServerHandler(CManager cm,CMConnection conn,void *vevent,void *client_data,attr_list attrs)

{
  ostream *poVar1;
  _KillResponseMsg kill_response_msg;
  stringstream Status;
  ulong local_1f8;
  char *pcStack_1f0;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  
  pcStack_1f0 = (char *)0x0;
  local_1f8 = (ulong)*vevent;
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(local_198,"ADIOS files Opened: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," gets for ",10);
  readable_size_abi_cxx11_(&local_1e8,TotalGetBytesSent);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")  Simple files opened: ",0x18);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (",2);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," reads for ",0xb);
  readable_size_abi_cxx11_(&local_1c8,TotalSimpleBytesSent);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  pcStack_1f0 = strdup(local_1e8._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  CMwrite(conn,*(undefined8 *)((long)client_data + 0x50),&local_1f8);
  free(pcStack_1f0);
  exit(0);
}

Assistant:

static void KillServerHandler(CManager cm, CMConnection conn, void *vevent, void *client_data,
                              attr_list attrs)
{
    KillServerMsg kill_msg = static_cast<KillServerMsg>(vevent);
    struct Remote_evpath_state *ev_state = static_cast<struct Remote_evpath_state *>(client_data);
    _KillResponseMsg kill_response_msg;
    memset(&kill_response_msg, 0, sizeof(kill_response_msg));
    kill_response_msg.KillResponseCondition = kill_msg->KillResponseCondition;
    std::stringstream Status;
    Status << "ADIOS files Opened: " << ADIOSFilesOpened << " (" << TotalGets << " gets for "
           << readable_size(TotalGetBytesSent) << ")  Simple files opened: " << SimpleFilesOpened
           << " (" << TotalSimpleReads << " reads for " << readable_size(TotalSimpleBytesSent)
           << ")";
    kill_response_msg.Status = strdup(Status.str().c_str());
    CMwrite(conn, ev_state->KillResponseFormat, &kill_response_msg);
    free(kill_response_msg.Status);
    exit(0);
}